

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode
SUNClassicalGS(N_Vector *v,sunrealtype **h,int k,int p,sunrealtype *new_vk_norm,sunrealtype *stemp,
              N_Vector *vtemp)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int nvec;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  undefined8 *in_R9;
  sunrealtype sVar4;
  undefined8 *in_stack_00000008;
  sunrealtype vk_norm;
  int k_minus_1;
  int i0;
  int i;
  SUNContext sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffff98;
  double dVar5;
  N_Vector in_stack_ffffffffffffffa0;
  N_Vector x;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector c;
  N_Vector x_00;
  int nvec_00;
  int local_34;
  
  iVar3 = in_EDX + -1;
  if (in_EDX - in_ECX < 1) {
    nvec = 0;
  }
  else {
    nvec = in_EDX - in_ECX;
  }
  nvec_00 = nvec;
  N_VDotProdMulti(nvec,in_stack_ffffffffffffffa8,(N_Vector *)in_stack_ffffffffffffffa0,
                  (sunrealtype *)in_stack_ffffffffffffff98);
  if (0.0 < (double)in_R9[in_EDX - nvec]) {
    c = (N_Vector)sqrt((double)in_R9[in_EDX - nvec]);
  }
  else {
    c = (N_Vector)0x0;
  }
  iVar2 = in_EDX - nvec;
  while (local_34 = iVar2 + -1, -1 < local_34) {
    *(undefined8 *)(*(long *)(in_RSI + (long)local_34 * 8) + (long)iVar3 * 8) = in_R9[local_34];
    in_R9[iVar2] = in_R9[local_34] ^ 0x8000000000000000;
    in_stack_00000008[iVar2] = *(undefined8 *)(in_RDI + (long)local_34 * 8);
    iVar2 = local_34;
  }
  *in_R9 = 0x3ff0000000000000;
  *in_stack_00000008 = *(undefined8 *)(in_RDI + (long)in_EDX * 8);
  x_00 = c;
  N_VLinearCombination
            (nvec_00,(sunrealtype *)c,(N_Vector *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  sVar4 = N_VDotProd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (0.0 < sVar4) {
    sVar4 = N_VDotProd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    x = (N_Vector)sqrt(sVar4);
  }
  else {
    x = (N_Vector)0x0;
  }
  *in_R8 = (double)x;
  if (*in_R8 * 1000.0 < (double)c) {
    N_VDotProdMulti(nvec_00,x_00,(N_Vector *)x,(sunrealtype *)in_stack_ffffffffffffff98);
    *in_R9 = 0x3ff0000000000000;
    *in_stack_00000008 = *(undefined8 *)(in_RDI + (long)in_EDX * 8);
    for (local_34 = nvec; local_34 < in_EDX; local_34 = local_34 + 1) {
      lVar1 = *(long *)(in_RSI + (long)local_34 * 8);
      *(double *)(lVar1 + (long)iVar3 * 8) =
           (double)in_R9[(local_34 - nvec) + 1] + *(double *)(lVar1 + (long)iVar3 * 8);
      in_R9[(local_34 - nvec) + 1] = in_R9[(local_34 - nvec) + 1] ^ 0x8000000000000000;
      in_stack_00000008[(local_34 - nvec) + 1] =
           *(undefined8 *)(in_RDI + (long)(local_34 - nvec) * 8);
    }
    N_VLinearCombination(nvec_00,(sunrealtype *)x_00,(N_Vector *)x,in_stack_ffffffffffffff98);
    sVar4 = N_VDotProd(x,in_stack_ffffffffffffff98);
    if (0.0 < sVar4) {
      sVar4 = N_VDotProd(x,in_stack_ffffffffffffff98);
      dVar5 = sqrt(sVar4);
    }
    else {
      dVar5 = 0.0;
    }
    *in_R8 = dVar5;
  }
  return 0;
}

Assistant:

SUNErrCode SUNClassicalGS(N_Vector* v, sunrealtype** h, int k, int p,
                          sunrealtype* new_vk_norm, sunrealtype* stemp,
                          N_Vector* vtemp)
{
  SUNFunctionBegin(v[0]->sunctx);
  int i, i0, k_minus_1;
  sunrealtype vk_norm;

  k_minus_1 = k - 1;
  i0        = SUNMAX(k - p, 0);

  /* Perform Classical Gram-Schmidt */

  SUNCheckCall(N_VDotProdMulti(k - i0 + 1, v[k], v + i0, stemp));

  vk_norm = SUNRsqrt(stemp[k - i0]);
  for (i = k - i0 - 1; i >= 0; i--)
  {
    h[i][k_minus_1] = stemp[i];
    stemp[i + 1]    = -stemp[i];
    vtemp[i + 1]    = v[i];
  }
  stemp[0] = ONE;
  vtemp[0] = v[k];

  SUNCheckCall(N_VLinearCombination(k - i0 + 1, stemp, vtemp, v[k]));

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
  SUNCheckLastErr();

  /* Reorthogonalize if necessary */

  if ((FACTOR * (*new_vk_norm)) < vk_norm)
  {
    SUNCheckCall(N_VDotProdMulti(k - i0, v[k], v + i0, stemp + 1));

    stemp[0] = ONE;
    vtemp[0] = v[k];
    for (i = i0; i < k; i++)
    {
      h[i][k_minus_1] += stemp[i - i0 + 1];
      stemp[i - i0 + 1] = -stemp[i - i0 + 1];
      vtemp[i - i0 + 1] = v[i - i0];
    }

    SUNCheckCall(N_VLinearCombination(k + 1, stemp, vtemp, v[k]));

    *new_vk_norm = SUNRsqrt(N_VDotProd(v[k], v[k]));
    SUNCheckLastErr();
  }

  return SUN_SUCCESS;
}